

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_arena_bins_print(emitter_t *emitter,_Bool mutex,uint i,uint64_t uptime)

{
  tsd_t *tsd;
  emitter_row_t eVar1;
  long lVar2;
  emitter_row_t eVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  emitter_output_t eVar7;
  uint uVar8;
  int iVar9;
  tsd_t *ptVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  undefined7 in_register_00000031;
  emitter_col_t *peVar14;
  undefined4 uVar15;
  uint64_t uVar16;
  long *in_FS_OFFSET;
  size_t miblen_new_2;
  emitter_row_t local_f40;
  emitter_row_t local_f38;
  size_t sz_2;
  uint64_t uptime_s;
  undefined4 local_f1c;
  uint32_t nregs;
  uint nbins;
  size_t curslabs;
  size_t curregs;
  undefined4 local_f00;
  uint32_t nshards;
  size_t stats_arenas_mib [7];
  uint64_t batch_pushed_elems;
  uint64_t batch_pushes;
  uint64_t batch_failed_pushes;
  uint64_t batch_pops;
  uint64_t nreslabs;
  uint64_t nflushes;
  uint64_t nfills;
  uint64_t nrequests;
  uint64_t ndalloc;
  uint64_t nmalloc;
  size_t nonfull_slabs;
  uint64_t nslabs;
  size_t slab_size;
  size_t reg_size;
  size_t page;
  size_t arenas_bin_mib [7];
  emitter_col_t header_justify_spacer;
  emitter_col_t header_push_elem_ps;
  emitter_col_t col_push_elem_ps;
  emitter_col_t header_push_elem;
  emitter_col_t col_push_elem;
  emitter_col_t header_push_ps;
  emitter_col_t col_push_ps;
  emitter_col_t header_push;
  emitter_col_t col_push;
  emitter_col_t header_failed_push_ps;
  emitter_col_t col_failed_push_ps;
  emitter_col_t header_failed_push;
  emitter_col_t col_failed_push;
  emitter_col_t header_pops_ps;
  emitter_col_t col_pops_ps;
  emitter_col_t header_pops;
  emitter_col_t col_pops;
  emitter_col_t header_nreslabs_ps;
  emitter_col_t col_nreslabs_ps;
  emitter_col_t header_nreslabs;
  emitter_col_t col_nreslabs;
  emitter_col_t header_nslabs;
  emitter_col_t col_nslabs;
  emitter_col_t header_nflushes_ps;
  emitter_col_t col_nflushes_ps;
  emitter_col_t header_nflushes;
  emitter_col_t col_nflushes;
  emitter_col_t header_nfills_ps;
  emitter_col_t col_nfills_ps;
  emitter_col_t header_nfills;
  emitter_col_t col_nfills;
  emitter_col_t header_util;
  emitter_col_t col_util;
  emitter_col_t col_justify_spacer;
  emitter_col_t header_pgs;
  emitter_col_t col_pgs;
  emitter_col_t header_regs;
  emitter_col_t col_regs;
  emitter_col_t header_nonfull_slabs;
  emitter_col_t col_nonfull_slabs;
  emitter_col_t header_curslabs;
  emitter_col_t col_curslabs;
  emitter_col_t header_curregs;
  emitter_col_t col_curregs;
  emitter_col_t header_nshards;
  emitter_col_t col_nshards;
  emitter_col_t header_nrequests_ps;
  emitter_col_t col_nrequests_ps;
  emitter_col_t header_nrequests;
  emitter_col_t col_nrequests;
  emitter_col_t header_ndalloc_ps;
  emitter_col_t col_ndalloc_ps;
  emitter_col_t col_mutex32 [1];
  emitter_col_t local_5b0;
  emitter_col_t col_mutex64 [11];
  emitter_col_t local_3c8;
  emitter_col_t local_3a0;
  emitter_col_t local_378;
  emitter_col_t local_350;
  emitter_col_t local_328;
  emitter_col_t local_300;
  emitter_col_t header_mutex32 [1];
  emitter_col_t local_2b0;
  emitter_col_t local_288;
  emitter_col_t local_260;
  emitter_col_t local_238;
  emitter_col_t local_210;
  emitter_col_t header_mutex64 [11];
  
  local_f1c = (undefined4)CONCAT71(in_register_00000031,mutex);
  col_mutex64[0].justify = 8;
  col_mutex64[0].width = 0;
  iVar6 = duckdb_je_mallctl("arenas.page",&page,(size_t *)col_mutex64,(void *)0x0,0);
  if (iVar6 == 0) {
    col_mutex64[0].justify = 4;
    col_mutex64[0].width = 0;
    iVar6 = duckdb_je_mallctl("arenas.nbins",&nbins,(size_t *)col_mutex64,(void *)0x0,0);
    if (iVar6 == 0) {
      local_300.justify = emitter_justify_right;
      local_300.width = 0x14;
      local_300.type = emitter_type_size;
      local_5b0.justify = emitter_justify_right;
      local_5b0.width = 0x14;
      local_5b0.type = emitter_type_title;
      local_5b0.field_3.str_val = "size";
      local_328.link.qre_prev = &local_300;
      local_300.link.qre_next = &local_328;
      local_328.justify = emitter_justify_right;
      local_328.width = 4;
      local_328.type = emitter_type_unsigned;
      local_210.link.qre_prev = &local_5b0;
      local_5b0.link.qre_next = &local_210;
      local_210.justify = emitter_justify_right;
      local_210.width = 4;
      local_210.type = emitter_type_title;
      local_210.field_3.str_val = "ind";
      local_350.link.qre_prev = &local_328;
      local_328.link.qre_next = &local_350;
      local_350.justify = emitter_justify_right;
      local_350.width = 0xd;
      local_350.type = emitter_type_size;
      local_238.link.qre_prev = &local_210;
      local_210.link.qre_next = &local_238;
      local_238.justify = emitter_justify_right;
      local_238.width = 0xd;
      local_238.type = emitter_type_title;
      local_238.field_3.str_val = "allocated";
      local_378.link.qre_prev = &local_350;
      local_350.link.qre_next = &local_378;
      local_378.justify = emitter_justify_right;
      local_378.width = 0xd;
      local_378.type = emitter_type_uint64;
      local_260.link.qre_prev = &local_238;
      local_238.link.qre_next = &local_260;
      local_260.justify = emitter_justify_right;
      local_260.width = 0xd;
      local_260.type = emitter_type_title;
      local_260.field_3.str_val = "nmalloc";
      local_3a0.link.qre_prev = &local_378;
      local_378.link.qre_next = &local_3a0;
      local_3a0.justify = emitter_justify_right;
      local_3a0.width = 8;
      local_3a0.type = emitter_type_uint64;
      local_288.link.qre_prev = &local_260;
      local_288.link.qre_next = &local_5b0;
      local_260.link.qre_next = &local_288;
      local_288.justify = emitter_justify_right;
      local_288.width = 8;
      local_288.type = emitter_type_title;
      local_288.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x141b58e;
      local_300.link.qre_prev = &local_3c8;
      local_3c8.link.qre_prev = &local_3a0;
      local_3c8.link.qre_next = &local_300;
      local_3a0.link.qre_next = &local_3c8;
      local_3c8.justify = emitter_justify_right;
      local_3c8.width = 0xd;
      local_3c8.type = emitter_type_uint64;
      local_288.link.qre_next = &local_2b0;
      local_5b0.link.qre_prev = local_288.link.qre_next;
      local_2b0.link.qre_prev = &local_288;
      local_2b0.link.qre_next = &local_5b0;
      local_2b0.justify = emitter_justify_right;
      local_2b0.width = 0xd;
      local_2b0.type = emitter_type_title;
      local_2b0.field_3.str_val = "ndalloc";
      col_ndalloc_ps.link.qre_next = &col_ndalloc_ps;
      col_ndalloc_ps.link.qre_prev = &col_ndalloc_ps;
      if (&local_300 != (emitter_col_t *)0x0) {
        col_ndalloc_ps.link.qre_next = &local_3c8;
        col_ndalloc_ps.link.qre_prev = &local_3c8;
        local_300.link.qre_prev = &col_ndalloc_ps;
      }
      col_ndalloc_ps.link.qre_next = col_ndalloc_ps.link.qre_prev;
      col_ndalloc_ps.justify = emitter_justify_right;
      col_ndalloc_ps.width = 8;
      col_ndalloc_ps.type = emitter_type_uint64;
      header_ndalloc_ps.link.qre_next = &header_ndalloc_ps;
      header_ndalloc_ps.link.qre_prev = &header_ndalloc_ps;
      if (&local_5b0 != (emitter_col_t *)0x0) {
        header_ndalloc_ps.link.qre_next = local_288.link.qre_next;
        header_ndalloc_ps.link.qre_prev = local_288.link.qre_next;
        local_5b0.link.qre_prev = &header_ndalloc_ps;
      }
      header_ndalloc_ps.link.qre_next = header_ndalloc_ps.link.qre_prev;
      header_ndalloc_ps.justify = emitter_justify_right;
      header_ndalloc_ps.width = 8;
      header_ndalloc_ps.type = emitter_type_title;
      header_ndalloc_ps.field_3.str_val = "(#/sec)";
      col_nrequests.link.qre_next = &col_nrequests;
      col_nrequests.link.qre_prev = col_nrequests.link.qre_next;
      if (col_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_nrequests.link.qre_next = ((col_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((col_ndalloc_ps.link.qre_prev)->link).qre_prev = &col_nrequests;
        col_nrequests.link.qre_prev = col_nrequests.link.qre_next;
        ((((col_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_ndalloc_ps.link.qre_next;
        ((col_nrequests.link.qre_next)->link).qre_next = &col_nrequests;
      }
      col_nrequests.justify = emitter_justify_right;
      col_nrequests.width = 0xd;
      col_nrequests.type = emitter_type_uint64;
      header_nrequests.link.qre_next = &header_nrequests;
      header_nrequests.link.qre_prev = header_nrequests.link.qre_next;
      if (header_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_nrequests.link.qre_next = ((header_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((header_ndalloc_ps.link.qre_prev)->link).qre_prev = &header_nrequests;
        header_nrequests.link.qre_prev = header_nrequests.link.qre_next;
        ((((header_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_ndalloc_ps.link.qre_next;
        ((header_nrequests.link.qre_next)->link).qre_next = &header_nrequests;
      }
      header_nrequests.justify = emitter_justify_right;
      header_nrequests.width = 0xd;
      header_nrequests.type = emitter_type_title;
      header_nrequests.field_3.str_val = "nrequests";
      col_nrequests_ps.link.qre_next = &col_nrequests_ps;
      col_nrequests_ps.link.qre_prev = col_nrequests_ps.link.qre_next;
      col_nrequests.link.qre_prev = col_nrequests.link.qre_next;
      if (col_nrequests.link.qre_next != (emitter_col_t *)0x0) {
        col_nrequests_ps.link.qre_next = ((col_nrequests.link.qre_next)->link).qre_prev;
        ((col_nrequests.link.qre_next)->link).qre_prev = &col_nrequests_ps;
        col_nrequests_ps.link.qre_prev = col_nrequests_ps.link.qre_next;
        ((((col_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests.link.qre_next;
        ((col_nrequests_ps.link.qre_next)->link).qre_next = &col_nrequests_ps;
      }
      col_nrequests_ps.justify = emitter_justify_right;
      col_nrequests_ps.width = 10;
      col_nrequests_ps.type = emitter_type_uint64;
      header_nrequests_ps.link.qre_next = &header_nrequests_ps;
      header_nrequests_ps.link.qre_prev = header_nrequests_ps.link.qre_next;
      header_nrequests.link.qre_prev = header_nrequests.link.qre_next;
      if (header_nrequests.link.qre_next != (emitter_col_t *)0x0) {
        header_nrequests_ps.link.qre_next = ((header_nrequests.link.qre_next)->link).qre_prev;
        ((header_nrequests.link.qre_next)->link).qre_prev = &header_nrequests_ps;
        header_nrequests_ps.link.qre_prev = header_nrequests_ps.link.qre_next;
        ((((header_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests.link.qre_next;
        ((header_nrequests_ps.link.qre_next)->link).qre_next = &header_nrequests_ps;
      }
      header_nrequests_ps.justify = emitter_justify_right;
      header_nrequests_ps.width = 10;
      header_nrequests_ps.type = emitter_type_title;
      header_nrequests_ps.field_3.str_val = "(#/sec)";
      col_nshards.link.qre_next = &col_nshards;
      col_nshards.link.qre_prev = col_nshards.link.qre_next;
      col_nrequests_ps.link.qre_prev = col_nrequests_ps.link.qre_next;
      if (col_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_nshards.link.qre_next = ((col_nrequests_ps.link.qre_next)->link).qre_prev;
        ((col_nrequests_ps.link.qre_next)->link).qre_prev = &col_nshards;
        col_nshards.link.qre_prev = col_nshards.link.qre_next;
        ((((col_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests_ps.link.qre_next;
        ((col_nshards.link.qre_next)->link).qre_next = &col_nshards;
      }
      col_nshards.justify = emitter_justify_right;
      col_nshards.width = 9;
      col_nshards.type = emitter_type_unsigned;
      header_nshards.link.qre_next = &header_nshards;
      header_nshards.link.qre_prev = header_nshards.link.qre_next;
      header_nrequests_ps.link.qre_prev = header_nrequests_ps.link.qre_next;
      if (header_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_nshards.link.qre_next = ((header_nrequests_ps.link.qre_next)->link).qre_prev;
        ((header_nrequests_ps.link.qre_next)->link).qre_prev = &header_nshards;
        header_nshards.link.qre_prev = header_nshards.link.qre_next;
        ((((header_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests_ps.link.qre_next;
        ((header_nshards.link.qre_next)->link).qre_next = &header_nshards;
      }
      header_nshards.justify = emitter_justify_right;
      header_nshards.width = 9;
      header_nshards.type = emitter_type_title;
      header_nshards.field_3.str_val = "nshards";
      col_curregs.link.qre_next = &col_curregs;
      col_curregs.link.qre_prev = col_curregs.link.qre_next;
      col_nshards.link.qre_prev = col_nshards.link.qre_next;
      if (col_nshards.link.qre_next != (emitter_col_t *)0x0) {
        col_curregs.link.qre_next = ((col_nshards.link.qre_next)->link).qre_prev;
        ((col_nshards.link.qre_next)->link).qre_prev = &col_curregs;
        col_curregs.link.qre_prev = col_curregs.link.qre_next;
        ((((col_nshards.link.qre_next)->link).qre_prev)->link).qre_next = col_nshards.link.qre_next;
        ((col_curregs.link.qre_next)->link).qre_next = &col_curregs;
      }
      col_curregs.justify = emitter_justify_right;
      col_curregs.width = 0xd;
      col_curregs.type = emitter_type_size;
      header_curregs.link.qre_next = &header_curregs;
      header_curregs.link.qre_prev = &header_curregs;
      header_nshards.link.qre_prev = header_nshards.link.qre_next;
      if (header_nshards.link.qre_next != (emitter_col_t *)0x0) {
        header_curregs.link.qre_next = ((header_nshards.link.qre_next)->link).qre_prev;
        ((header_nshards.link.qre_next)->link).qre_prev = &header_curregs;
        header_curregs.link.qre_prev = header_curregs.link.qre_next;
        ((((header_nshards.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nshards.link.qre_next;
        ((header_curregs.link.qre_next)->link).qre_next = &header_curregs;
      }
      header_curregs.justify = emitter_justify_right;
      header_curregs.width = 0xd;
      header_curregs.type = emitter_type_title;
      header_curregs.field_3.str_val = "curregs";
      col_curslabs.link.qre_next = &col_curslabs;
      col_curslabs.link.qre_prev = col_curslabs.link.qre_next;
      col_curregs.link.qre_prev = col_curregs.link.qre_next;
      if (col_curregs.link.qre_next != (emitter_col_t *)0x0) {
        col_curslabs.link.qre_next = ((col_curregs.link.qre_next)->link).qre_prev;
        ((col_curregs.link.qre_next)->link).qre_prev = &col_curslabs;
        col_curslabs.link.qre_prev = col_curslabs.link.qre_next;
        ((((col_curregs.link.qre_next)->link).qre_prev)->link).qre_next = col_curregs.link.qre_next;
        ((col_curslabs.link.qre_next)->link).qre_next = &col_curslabs;
      }
      col_curslabs.justify = emitter_justify_right;
      col_curslabs.width = 0xd;
      col_curslabs.type = emitter_type_size;
      header_curslabs.link.qre_next = &header_curslabs;
      header_curslabs.link.qre_prev = header_curslabs.link.qre_next;
      header_curregs.link.qre_prev = header_curregs.link.qre_next;
      if (header_curregs.link.qre_next != (emitter_col_t *)0x0) {
        header_curslabs.link.qre_next = ((header_curregs.link.qre_next)->link).qre_prev;
        ((header_curregs.link.qre_next)->link).qre_prev = &header_curslabs;
        header_curslabs.link.qre_prev = header_curslabs.link.qre_next;
        ((((header_curregs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_curregs.link.qre_next;
        ((header_curslabs.link.qre_next)->link).qre_next = &header_curslabs;
      }
      header_curslabs.justify = emitter_justify_right;
      header_curslabs.width = 0xd;
      header_curslabs.type = emitter_type_title;
      header_curslabs.field_3.str_val = "curslabs";
      col_nonfull_slabs.link.qre_next = &col_nonfull_slabs;
      col_nonfull_slabs.link.qre_prev = col_nonfull_slabs.link.qre_next;
      col_curslabs.link.qre_prev = col_curslabs.link.qre_next;
      if (col_curslabs.link.qre_next != (emitter_col_t *)0x0) {
        col_nonfull_slabs.link.qre_next = ((col_curslabs.link.qre_next)->link).qre_prev;
        ((col_curslabs.link.qre_next)->link).qre_prev = &col_nonfull_slabs;
        col_nonfull_slabs.link.qre_prev = col_nonfull_slabs.link.qre_next;
        ((((col_curslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             col_curslabs.link.qre_next;
        ((col_nonfull_slabs.link.qre_next)->link).qre_next = &col_nonfull_slabs;
      }
      col_nonfull_slabs.justify = emitter_justify_right;
      col_nonfull_slabs.width = 0xf;
      col_nonfull_slabs.type = emitter_type_size;
      header_nonfull_slabs.link.qre_next = &header_nonfull_slabs;
      header_nonfull_slabs.link.qre_prev = header_nonfull_slabs.link.qre_next;
      header_curslabs.link.qre_prev = header_curslabs.link.qre_next;
      if (header_curslabs.link.qre_next != (emitter_col_t *)0x0) {
        header_nonfull_slabs.link.qre_next = ((header_curslabs.link.qre_next)->link).qre_prev;
        ((header_curslabs.link.qre_next)->link).qre_prev = &header_nonfull_slabs;
        header_nonfull_slabs.link.qre_prev = header_nonfull_slabs.link.qre_next;
        ((((header_curslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_curslabs.link.qre_next;
        ((header_nonfull_slabs.link.qre_next)->link).qre_next = &header_nonfull_slabs;
      }
      header_nonfull_slabs.justify = emitter_justify_right;
      header_nonfull_slabs.width = 0xf;
      header_nonfull_slabs.type = emitter_type_title;
      header_nonfull_slabs.field_3.str_val = "nonfull_slabs";
      col_regs.link.qre_next = &col_regs;
      col_regs.link.qre_prev = col_regs.link.qre_next;
      col_nonfull_slabs.link.qre_prev = col_nonfull_slabs.link.qre_next;
      if (col_nonfull_slabs.link.qre_next != (emitter_col_t *)0x0) {
        col_regs.link.qre_next = ((col_nonfull_slabs.link.qre_next)->link).qre_prev;
        ((col_nonfull_slabs.link.qre_next)->link).qre_prev = &col_regs;
        col_regs.link.qre_prev = col_regs.link.qre_next;
        ((((col_nonfull_slabs.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nonfull_slabs.link.qre_next;
        ((col_regs.link.qre_next)->link).qre_next = &col_regs;
      }
      col_regs.justify = emitter_justify_right;
      col_regs.width = 5;
      col_regs.type = emitter_type_unsigned;
      header_regs.link.qre_next = &header_regs;
      header_regs.link.qre_prev = header_regs.link.qre_next;
      header_nonfull_slabs.link.qre_prev = header_nonfull_slabs.link.qre_next;
      if (header_nonfull_slabs.link.qre_next != (emitter_col_t *)0x0) {
        header_regs.link.qre_next = ((header_nonfull_slabs.link.qre_next)->link).qre_prev;
        ((header_nonfull_slabs.link.qre_next)->link).qre_prev = &header_regs;
        header_regs.link.qre_prev = header_regs.link.qre_next;
        ((((header_nonfull_slabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nonfull_slabs.link.qre_next;
        ((header_regs.link.qre_next)->link).qre_next = &header_regs;
      }
      header_regs.justify = emitter_justify_right;
      header_regs.width = 5;
      header_regs.type = emitter_type_title;
      header_regs.field_3.str_val = "regs";
      col_pgs.link.qre_next = &col_pgs;
      col_pgs.link.qre_prev = col_pgs.link.qre_next;
      col_regs.link.qre_prev = col_regs.link.qre_next;
      if (col_regs.link.qre_next != (emitter_col_t *)0x0) {
        col_pgs.link.qre_next = ((col_regs.link.qre_next)->link).qre_prev;
        ((col_regs.link.qre_next)->link).qre_prev = &col_pgs;
        col_pgs.link.qre_prev = col_pgs.link.qre_next;
        ((((col_regs.link.qre_next)->link).qre_prev)->link).qre_next = col_regs.link.qre_next;
        ((col_pgs.link.qre_next)->link).qre_next = &col_pgs;
      }
      col_pgs.justify = emitter_justify_right;
      col_pgs.width = 4;
      col_pgs.type = emitter_type_size;
      header_pgs.link.qre_next = &header_pgs;
      header_pgs.link.qre_prev = header_pgs.link.qre_next;
      header_regs.link.qre_prev = header_regs.link.qre_next;
      if (header_regs.link.qre_next != (emitter_col_t *)0x0) {
        header_pgs.link.qre_next = ((header_regs.link.qre_next)->link).qre_prev;
        ((header_regs.link.qre_next)->link).qre_prev = &header_pgs;
        header_pgs.link.qre_prev = header_pgs.link.qre_next;
        ((((header_regs.link.qre_next)->link).qre_prev)->link).qre_next = header_regs.link.qre_next;
        ((header_pgs.link.qre_next)->link).qre_next = &header_pgs;
      }
      header_pgs.justify = emitter_justify_right;
      header_pgs.width = 4;
      header_pgs.type = emitter_type_title;
      header_pgs.field_3.str_val = "pgs";
      col_justify_spacer.link.qre_next = &col_justify_spacer;
      col_justify_spacer.link.qre_prev = col_justify_spacer.link.qre_next;
      col_pgs.link.qre_prev = col_pgs.link.qre_next;
      if (col_pgs.link.qre_next != (emitter_col_t *)0x0) {
        col_justify_spacer.link.qre_next = ((col_pgs.link.qre_next)->link).qre_prev;
        ((col_pgs.link.qre_next)->link).qre_prev = &col_justify_spacer;
        col_justify_spacer.link.qre_prev = col_justify_spacer.link.qre_next;
        ((((col_pgs.link.qre_next)->link).qre_prev)->link).qre_next = col_pgs.link.qre_next;
        ((col_justify_spacer.link.qre_next)->link).qre_next = &col_justify_spacer;
      }
      col_justify_spacer.justify = emitter_justify_right;
      col_justify_spacer.width = 1;
      col_justify_spacer.type = emitter_type_title;
      header_justify_spacer.link.qre_next = &header_justify_spacer;
      header_justify_spacer.link.qre_prev = header_justify_spacer.link.qre_next;
      header_pgs.link.qre_prev = header_pgs.link.qre_next;
      if (header_pgs.link.qre_next != (emitter_col_t *)0x0) {
        header_justify_spacer.link.qre_next = ((header_pgs.link.qre_next)->link).qre_prev;
        ((header_pgs.link.qre_next)->link).qre_prev = &header_justify_spacer;
        header_justify_spacer.link.qre_prev = header_justify_spacer.link.qre_next;
        ((((header_pgs.link.qre_next)->link).qre_prev)->link).qre_next = header_pgs.link.qre_next;
        ((header_justify_spacer.link.qre_next)->link).qre_next = &header_justify_spacer;
      }
      header_justify_spacer.justify = emitter_justify_right;
      header_justify_spacer.width = 1;
      header_justify_spacer.type = emitter_type_title;
      peVar14 = &col_util;
      col_util.link.qre_next = peVar14;
      col_util.link.qre_prev = peVar14;
      col_justify_spacer.link.qre_prev = col_justify_spacer.link.qre_next;
      if (col_justify_spacer.link.qre_next != (emitter_col_t *)0x0) {
        peVar14 = ((col_justify_spacer.link.qre_next)->link).qre_prev;
        col_util.link.qre_next = peVar14;
        ((col_justify_spacer.link.qre_next)->link).qre_prev = &col_util;
        col_util.link.qre_prev = peVar14;
        ((((col_justify_spacer.link.qre_next)->link).qre_prev)->link).qre_next =
             col_justify_spacer.link.qre_next;
        (peVar14->link).qre_next = &col_util;
      }
      col_util.justify = emitter_justify_right;
      col_util.width = 6;
      col_util.type = emitter_type_title;
      header_util.link.qre_next = &header_util;
      header_util.link.qre_prev = &header_util;
      header_justify_spacer.link.qre_prev = header_justify_spacer.link.qre_next;
      col_util.link.qre_next = peVar14;
      col_util.link.qre_prev = peVar14;
      if (header_justify_spacer.link.qre_next != (emitter_col_t *)0x0) {
        header_util.link.qre_next = ((header_justify_spacer.link.qre_next)->link).qre_prev;
        ((header_justify_spacer.link.qre_next)->link).qre_prev = &header_util;
        header_util.link.qre_prev = ((header_util.link.qre_prev)->link).qre_next;
        ((((header_justify_spacer.link.qre_next)->link).qre_prev)->link).qre_next =
             header_justify_spacer.link.qre_next;
        ((header_util.link.qre_prev)->link).qre_next = &header_util;
      }
      header_util.justify = emitter_justify_right;
      header_util.width = 6;
      header_util.type = emitter_type_title;
      header_util.field_3.str_val = "util";
      col_nfills.link.qre_next = &col_nfills;
      col_nfills.link.qre_prev = col_nfills.link.qre_next;
      if (peVar14 != (emitter_col_t *)0x0) {
        col_nfills.link.qre_next = (peVar14->link).qre_prev;
        (peVar14->link).qre_prev = &col_nfills;
        col_nfills.link.qre_prev = col_nfills.link.qre_next;
        (((peVar14->link).qre_prev)->link).qre_next = peVar14;
        ((col_nfills.link.qre_next)->link).qre_next = &col_nfills;
      }
      col_nfills.justify = emitter_justify_right;
      col_nfills.width = 0xd;
      col_nfills.type = emitter_type_uint64;
      header_nfills.link.qre_next = &header_nfills;
      header_nfills.link.qre_prev = header_nfills.link.qre_next;
      if (header_util.link.qre_next != (emitter_col_t *)0x0) {
        header_nfills.link.qre_next = ((header_util.link.qre_next)->link).qre_prev;
        ((header_util.link.qre_next)->link).qre_prev = &header_nfills;
        header_nfills.link.qre_prev = header_nfills.link.qre_next;
        ((((header_util.link.qre_next)->link).qre_prev)->link).qre_next = header_util.link.qre_next;
        ((header_nfills.link.qre_next)->link).qre_next = &header_nfills;
      }
      header_nfills.justify = emitter_justify_right;
      header_nfills.width = 0xd;
      header_nfills.type = emitter_type_title;
      header_nfills.field_3.str_val = "nfills";
      col_nfills_ps.link.qre_next = &col_nfills_ps;
      col_nfills_ps.link.qre_prev = &col_nfills_ps;
      col_nfills.link.qre_prev = col_nfills.link.qre_next;
      if (col_nfills.link.qre_next != (emitter_col_t *)0x0) {
        col_nfills_ps.link.qre_next = ((col_nfills.link.qre_next)->link).qre_prev;
        ((col_nfills.link.qre_next)->link).qre_prev = &col_nfills_ps;
        col_nfills_ps.link.qre_prev = col_nfills_ps.link.qre_next;
        ((((col_nfills.link.qre_next)->link).qre_prev)->link).qre_next = col_nfills.link.qre_next;
        ((col_nfills_ps.link.qre_next)->link).qre_next = &col_nfills_ps;
      }
      col_nfills_ps.justify = emitter_justify_right;
      col_nfills_ps.width = 8;
      col_nfills_ps.type = emitter_type_uint64;
      header_nfills_ps.link.qre_next = &header_nfills_ps;
      header_nfills_ps.link.qre_prev = &header_nfills_ps;
      header_nfills.link.qre_prev = header_nfills.link.qre_next;
      if (header_nfills.link.qre_next != (emitter_col_t *)0x0) {
        header_nfills_ps.link.qre_next = ((header_nfills.link.qre_next)->link).qre_prev;
        ((header_nfills.link.qre_next)->link).qre_prev = &header_nfills_ps;
        header_nfills_ps.link.qre_prev = header_nfills_ps.link.qre_next;
        ((((header_nfills.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nfills.link.qre_next;
        ((header_nfills_ps.link.qre_next)->link).qre_next = &header_nfills_ps;
      }
      header_nfills_ps.justify = emitter_justify_right;
      header_nfills_ps.width = 8;
      header_nfills_ps.type = emitter_type_title;
      header_nfills_ps.field_3.str_val = "(#/sec)";
      col_nflushes.link.qre_next = &col_nflushes;
      col_nflushes.link.qre_prev = col_nflushes.link.qre_next;
      col_nfills_ps.link.qre_prev = col_nfills_ps.link.qre_next;
      if (col_nfills_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_nflushes.link.qre_next = ((col_nfills_ps.link.qre_next)->link).qre_prev;
        ((col_nfills_ps.link.qre_next)->link).qre_prev = &col_nflushes;
        col_nflushes.link.qre_prev = col_nflushes.link.qre_next;
        ((((col_nfills_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nfills_ps.link.qre_next;
        ((col_nflushes.link.qre_next)->link).qre_next = &col_nflushes;
      }
      col_nflushes.justify = emitter_justify_right;
      col_nflushes.width = 0xd;
      col_nflushes.type = emitter_type_uint64;
      header_nflushes.link.qre_next = &header_nflushes;
      header_nflushes.link.qre_prev = header_nflushes.link.qre_next;
      header_nfills_ps.link.qre_prev = header_nfills_ps.link.qre_next;
      if (header_nfills_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_nflushes.link.qre_next = ((header_nfills_ps.link.qre_next)->link).qre_prev;
        ((header_nfills_ps.link.qre_next)->link).qre_prev = &header_nflushes;
        header_nflushes.link.qre_prev = header_nflushes.link.qre_next;
        ((((header_nfills_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nfills_ps.link.qre_next;
        ((header_nflushes.link.qre_next)->link).qre_next = &header_nflushes;
      }
      header_nflushes.justify = emitter_justify_right;
      header_nflushes.width = 0xd;
      header_nflushes.type = emitter_type_title;
      header_nflushes.field_3.str_val = "nflushes";
      col_nflushes_ps.link.qre_next = &col_nflushes_ps;
      col_nflushes_ps.link.qre_prev = col_nflushes_ps.link.qre_next;
      col_nflushes.link.qre_prev = col_nflushes.link.qre_next;
      if (col_nflushes.link.qre_next != (emitter_col_t *)0x0) {
        col_nflushes_ps.link.qre_next = ((col_nflushes.link.qre_next)->link).qre_prev;
        ((col_nflushes.link.qre_next)->link).qre_prev = &col_nflushes_ps;
        col_nflushes_ps.link.qre_prev = col_nflushes_ps.link.qre_next;
        ((((col_nflushes.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nflushes.link.qre_next;
        ((col_nflushes_ps.link.qre_next)->link).qre_next = &col_nflushes_ps;
      }
      col_nflushes_ps.justify = emitter_justify_right;
      col_nflushes_ps.width = 8;
      col_nflushes_ps.type = emitter_type_uint64;
      header_nflushes_ps.link.qre_next = &header_nflushes_ps;
      header_nflushes_ps.link.qre_prev = &header_nflushes_ps;
      header_nflushes.link.qre_prev = header_nflushes.link.qre_next;
      if (header_nflushes.link.qre_next != (emitter_col_t *)0x0) {
        header_nflushes_ps.link.qre_next = ((header_nflushes.link.qre_next)->link).qre_prev;
        ((header_nflushes.link.qre_next)->link).qre_prev = &header_nflushes_ps;
        header_nflushes_ps.link.qre_prev = header_nflushes_ps.link.qre_next;
        ((((header_nflushes.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nflushes.link.qre_next;
        ((header_nflushes_ps.link.qre_next)->link).qre_next = &header_nflushes_ps;
      }
      header_nflushes_ps.justify = emitter_justify_right;
      header_nflushes_ps.width = 8;
      header_nflushes_ps.type = emitter_type_title;
      header_nflushes_ps.field_3.str_val = "(#/sec)";
      col_nslabs.link.qre_next = &col_nslabs;
      col_nslabs.link.qre_prev = col_nslabs.link.qre_next;
      col_nflushes_ps.link.qre_prev = col_nflushes_ps.link.qre_next;
      if (col_nflushes_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_nslabs.link.qre_next = ((col_nflushes_ps.link.qre_next)->link).qre_prev;
        ((col_nflushes_ps.link.qre_next)->link).qre_prev = &col_nslabs;
        col_nslabs.link.qre_prev = col_nslabs.link.qre_next;
        ((((col_nflushes_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nflushes_ps.link.qre_next;
        ((col_nslabs.link.qre_next)->link).qre_next = &col_nslabs;
      }
      col_nslabs.justify = emitter_justify_right;
      col_nslabs.width = 0xd;
      col_nslabs.type = emitter_type_uint64;
      header_nslabs.link.qre_next = &header_nslabs;
      header_nslabs.link.qre_prev = header_nslabs.link.qre_next;
      header_nflushes_ps.link.qre_prev = header_nflushes_ps.link.qre_next;
      if (header_nflushes_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_nslabs.link.qre_next = ((header_nflushes_ps.link.qre_next)->link).qre_prev;
        ((header_nflushes_ps.link.qre_next)->link).qre_prev = &header_nslabs;
        header_nslabs.link.qre_prev = header_nslabs.link.qre_next;
        ((((header_nflushes_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nflushes_ps.link.qre_next;
        ((header_nslabs.link.qre_next)->link).qre_next = &header_nslabs;
      }
      header_nslabs.justify = emitter_justify_right;
      header_nslabs.width = 0xd;
      header_nslabs.type = emitter_type_title;
      header_nslabs.field_3.str_val = "nslabs";
      col_nreslabs.link.qre_next = &col_nreslabs;
      col_nreslabs.link.qre_prev = col_nreslabs.link.qre_next;
      col_nslabs.link.qre_prev = col_nslabs.link.qre_next;
      if (col_nslabs.link.qre_next != (emitter_col_t *)0x0) {
        col_nreslabs.link.qre_next = ((col_nslabs.link.qre_next)->link).qre_prev;
        ((col_nslabs.link.qre_next)->link).qre_prev = &col_nreslabs;
        col_nreslabs.link.qre_prev = col_nreslabs.link.qre_next;
        ((((col_nslabs.link.qre_next)->link).qre_prev)->link).qre_next = col_nslabs.link.qre_next;
        ((col_nreslabs.link.qre_next)->link).qre_next = &col_nreslabs;
      }
      col_nreslabs.justify = emitter_justify_right;
      col_nreslabs.width = 0xd;
      col_nreslabs.type = emitter_type_uint64;
      header_nreslabs.link.qre_next = &header_nreslabs;
      header_nreslabs.link.qre_prev = header_nreslabs.link.qre_next;
      header_nslabs.link.qre_prev = header_nslabs.link.qre_next;
      if (header_nslabs.link.qre_next != (emitter_col_t *)0x0) {
        header_nreslabs.link.qre_next = ((header_nslabs.link.qre_next)->link).qre_prev;
        ((header_nslabs.link.qre_next)->link).qre_prev = &header_nreslabs;
        header_nreslabs.link.qre_prev = header_nreslabs.link.qre_next;
        ((((header_nslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nslabs.link.qre_next;
        ((header_nreslabs.link.qre_next)->link).qre_next = &header_nreslabs;
      }
      header_nreslabs.justify = emitter_justify_right;
      header_nreslabs.width = 0xd;
      header_nreslabs.type = emitter_type_title;
      header_nreslabs.field_3.str_val = "nreslabs";
      col_nreslabs_ps.link.qre_next = &col_nreslabs_ps;
      col_nreslabs_ps.link.qre_prev = col_nreslabs_ps.link.qre_next;
      col_nreslabs.link.qre_prev = col_nreslabs.link.qre_next;
      if (col_nreslabs.link.qre_next != (emitter_col_t *)0x0) {
        col_nreslabs_ps.link.qre_next = ((col_nreslabs.link.qre_next)->link).qre_prev;
        ((col_nreslabs.link.qre_next)->link).qre_prev = &col_nreslabs_ps;
        col_nreslabs_ps.link.qre_prev = col_nreslabs_ps.link.qre_next;
        ((((col_nreslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nreslabs.link.qre_next;
        ((col_nreslabs_ps.link.qre_next)->link).qre_next = &col_nreslabs_ps;
      }
      col_nreslabs_ps.justify = emitter_justify_right;
      col_nreslabs_ps.width = 8;
      col_nreslabs_ps.type = emitter_type_uint64;
      header_nreslabs_ps.link.qre_next = &header_nreslabs_ps;
      header_nreslabs_ps.link.qre_prev = header_nreslabs_ps.link.qre_next;
      header_nreslabs.link.qre_prev = header_nreslabs.link.qre_next;
      if (header_nreslabs.link.qre_next != (emitter_col_t *)0x0) {
        header_nreslabs_ps.link.qre_next = ((header_nreslabs.link.qre_next)->link).qre_prev;
        ((header_nreslabs.link.qre_next)->link).qre_prev = &header_nreslabs_ps;
        header_nreslabs_ps.link.qre_prev = header_nreslabs_ps.link.qre_next;
        ((((header_nreslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nreslabs.link.qre_next;
        ((header_nreslabs_ps.link.qre_next)->link).qre_next = &header_nreslabs_ps;
      }
      header_nreslabs_ps.justify = emitter_justify_right;
      header_nreslabs_ps.width = 8;
      header_nreslabs_ps.type = emitter_type_title;
      header_nreslabs_ps.field_3.str_val = "(#/sec)";
      col_pops.link.qre_next = &col_pops;
      col_pops.link.qre_prev = col_pops.link.qre_next;
      col_nreslabs_ps.link.qre_prev = col_nreslabs_ps.link.qre_next;
      if (col_nreslabs_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_pops.link.qre_next = ((col_nreslabs_ps.link.qre_next)->link).qre_prev;
        ((col_nreslabs_ps.link.qre_next)->link).qre_prev = &col_pops;
        col_pops.link.qre_prev = col_pops.link.qre_next;
        ((((col_nreslabs_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nreslabs_ps.link.qre_next;
        ((col_pops.link.qre_next)->link).qre_next = &col_pops;
      }
      col_pops.justify = emitter_justify_right;
      col_pops.width = 10;
      col_pops.type = emitter_type_uint64;
      header_pops.link.qre_next = &header_pops;
      header_pops.link.qre_prev = header_pops.link.qre_next;
      header_nreslabs_ps.link.qre_prev = header_nreslabs_ps.link.qre_next;
      if (header_nreslabs_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_pops.link.qre_next = ((header_nreslabs_ps.link.qre_next)->link).qre_prev;
        ((header_nreslabs_ps.link.qre_next)->link).qre_prev = &header_pops;
        header_pops.link.qre_prev = header_pops.link.qre_next;
        ((((header_nreslabs_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nreslabs_ps.link.qre_next;
        ((header_pops.link.qre_next)->link).qre_next = &header_pops;
      }
      header_pops.justify = emitter_justify_right;
      header_pops.width = 10;
      header_pops.type = emitter_type_title;
      header_pops.field_3.str_val = "pops";
      col_pops_ps.link.qre_next = &col_pops_ps;
      col_pops_ps.link.qre_prev = &col_pops_ps;
      col_pops.link.qre_prev = col_pops.link.qre_next;
      if (col_pops.link.qre_next != (emitter_col_t *)0x0) {
        col_pops_ps.link.qre_next = ((col_pops.link.qre_next)->link).qre_prev;
        ((col_pops.link.qre_next)->link).qre_prev = &col_pops_ps;
        col_pops_ps.link.qre_prev = col_pops_ps.link.qre_next;
        ((((col_pops.link.qre_next)->link).qre_prev)->link).qre_next = col_pops.link.qre_next;
        ((col_pops_ps.link.qre_next)->link).qre_next = &col_pops_ps;
      }
      col_pops_ps.justify = emitter_justify_right;
      col_pops_ps.width = 8;
      col_pops_ps.type = emitter_type_uint64;
      header_pops_ps.link.qre_next = &header_pops_ps;
      header_pops_ps.link.qre_prev = header_pops_ps.link.qre_next;
      header_pops.link.qre_prev = header_pops.link.qre_next;
      if (header_pops.link.qre_next != (emitter_col_t *)0x0) {
        header_pops_ps.link.qre_next = ((header_pops.link.qre_next)->link).qre_prev;
        ((header_pops.link.qre_next)->link).qre_prev = &header_pops_ps;
        header_pops_ps.link.qre_prev = header_pops_ps.link.qre_next;
        ((((header_pops.link.qre_next)->link).qre_prev)->link).qre_next = header_pops.link.qre_next;
        ((header_pops_ps.link.qre_next)->link).qre_next = &header_pops_ps;
      }
      header_pops_ps.justify = emitter_justify_right;
      header_pops_ps.width = 8;
      header_pops_ps.type = emitter_type_title;
      header_pops_ps.field_3.str_val = "(#/sec)";
      col_failed_push.link.qre_next = &col_failed_push;
      col_failed_push.link.qre_prev = col_failed_push.link.qre_next;
      col_pops_ps.link.qre_prev = col_pops_ps.link.qre_next;
      if (col_pops_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_failed_push.link.qre_next = ((col_pops_ps.link.qre_next)->link).qre_prev;
        ((col_pops_ps.link.qre_next)->link).qre_prev = &col_failed_push;
        col_failed_push.link.qre_prev = col_failed_push.link.qre_next;
        ((((col_pops_ps.link.qre_next)->link).qre_prev)->link).qre_next = col_pops_ps.link.qre_next;
        ((col_failed_push.link.qre_next)->link).qre_next = &col_failed_push;
      }
      col_failed_push.justify = emitter_justify_right;
      col_failed_push.width = 0xd;
      col_failed_push.type = emitter_type_uint64;
      header_failed_push.link.qre_next = &header_failed_push;
      header_failed_push.link.qre_prev = header_failed_push.link.qre_next;
      header_pops_ps.link.qre_prev = header_pops_ps.link.qre_next;
      if (header_pops_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_failed_push.link.qre_next = ((header_pops_ps.link.qre_next)->link).qre_prev;
        ((header_pops_ps.link.qre_next)->link).qre_prev = &header_failed_push;
        header_failed_push.link.qre_prev = header_failed_push.link.qre_next;
        ((((header_pops_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_pops_ps.link.qre_next;
        ((header_failed_push.link.qre_next)->link).qre_next = &header_failed_push;
      }
      header_failed_push.justify = emitter_justify_right;
      header_failed_push.width = 0xd;
      header_failed_push.type = emitter_type_title;
      header_failed_push.field_3.str_val = "failed_push";
      col_failed_push_ps.link.qre_next = &col_failed_push_ps;
      col_failed_push_ps.link.qre_prev = &col_failed_push_ps;
      col_failed_push.link.qre_prev = col_failed_push.link.qre_next;
      if (col_failed_push.link.qre_next != (emitter_col_t *)0x0) {
        col_failed_push_ps.link.qre_next = ((col_failed_push.link.qre_next)->link).qre_prev;
        ((col_failed_push.link.qre_next)->link).qre_prev = &col_failed_push_ps;
        col_failed_push_ps.link.qre_prev = col_failed_push_ps.link.qre_next;
        ((((col_failed_push.link.qre_next)->link).qre_prev)->link).qre_next =
             col_failed_push.link.qre_next;
        ((col_failed_push_ps.link.qre_next)->link).qre_next = &col_failed_push_ps;
      }
      col_failed_push_ps.justify = emitter_justify_right;
      col_failed_push_ps.width = 8;
      col_failed_push_ps.type = emitter_type_uint64;
      header_failed_push_ps.link.qre_next = &header_failed_push_ps;
      header_failed_push_ps.link.qre_prev = &header_failed_push_ps;
      header_failed_push.link.qre_prev = header_failed_push.link.qre_next;
      if (header_failed_push.link.qre_next != (emitter_col_t *)0x0) {
        header_failed_push_ps.link.qre_next = ((header_failed_push.link.qre_next)->link).qre_prev;
        ((header_failed_push.link.qre_next)->link).qre_prev = &header_failed_push_ps;
        header_failed_push_ps.link.qre_prev = header_failed_push_ps.link.qre_next;
        ((((header_failed_push.link.qre_next)->link).qre_prev)->link).qre_next =
             header_failed_push.link.qre_next;
        ((header_failed_push_ps.link.qre_next)->link).qre_next = &header_failed_push_ps;
      }
      header_failed_push_ps.justify = emitter_justify_right;
      header_failed_push_ps.width = 8;
      header_failed_push_ps.type = emitter_type_title;
      header_failed_push_ps.field_3.str_val = "(#/sec)";
      col_push.link.qre_next = &col_push;
      col_push.link.qre_prev = col_push.link.qre_next;
      col_failed_push_ps.link.qre_prev = col_failed_push_ps.link.qre_next;
      if (col_failed_push_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_push.link.qre_next = ((col_failed_push_ps.link.qre_next)->link).qre_prev;
        ((col_failed_push_ps.link.qre_next)->link).qre_prev = &col_push;
        col_push.link.qre_prev = col_push.link.qre_next;
        ((((col_failed_push_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_failed_push_ps.link.qre_next;
        ((col_push.link.qre_next)->link).qre_next = &col_push;
      }
      col_push.justify = emitter_justify_right;
      col_push.width = 7;
      col_push.type = emitter_type_uint64;
      header_push.link.qre_next = &header_push;
      header_push.link.qre_prev = header_push.link.qre_next;
      header_failed_push_ps.link.qre_prev = header_failed_push_ps.link.qre_next;
      if (header_failed_push_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_push.link.qre_next = ((header_failed_push_ps.link.qre_next)->link).qre_prev;
        ((header_failed_push_ps.link.qre_next)->link).qre_prev = &header_push;
        header_push.link.qre_prev = header_push.link.qre_next;
        ((((header_failed_push_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_failed_push_ps.link.qre_next;
        ((header_push.link.qre_next)->link).qre_next = &header_push;
      }
      header_push.justify = emitter_justify_right;
      header_push.width = 7;
      header_push.type = emitter_type_title;
      header_push.field_3.str_val = "push";
      col_push_ps.link.qre_next = &col_push_ps;
      col_push_ps.link.qre_prev = col_push_ps.link.qre_next;
      col_push.link.qre_prev = col_push.link.qre_next;
      if (col_push.link.qre_next != (emitter_col_t *)0x0) {
        col_push_ps.link.qre_next = ((col_push.link.qre_next)->link).qre_prev;
        ((col_push.link.qre_next)->link).qre_prev = &col_push_ps;
        col_push_ps.link.qre_prev = col_push_ps.link.qre_next;
        ((((col_push.link.qre_next)->link).qre_prev)->link).qre_next = col_push.link.qre_next;
        ((col_push_ps.link.qre_next)->link).qre_next = &col_push_ps;
      }
      col_push_ps.justify = emitter_justify_right;
      col_push_ps.width = 8;
      col_push_ps.type = emitter_type_uint64;
      header_push_ps.link.qre_next = &header_push_ps;
      header_push_ps.link.qre_prev = &header_push_ps;
      header_push.link.qre_prev = header_push.link.qre_next;
      if (header_push.link.qre_next != (emitter_col_t *)0x0) {
        header_push_ps.link.qre_next = ((header_push.link.qre_next)->link).qre_prev;
        ((header_push.link.qre_next)->link).qre_prev = &header_push_ps;
        header_push_ps.link.qre_prev = header_push_ps.link.qre_next;
        ((((header_push.link.qre_next)->link).qre_prev)->link).qre_next = header_push.link.qre_next;
        ((header_push_ps.link.qre_next)->link).qre_next = &header_push_ps;
      }
      header_push_ps.justify = emitter_justify_right;
      header_push_ps.width = 8;
      header_push_ps.type = emitter_type_title;
      header_push_ps.field_3.str_val = "(#/sec)";
      col_push_elem.link.qre_next = &col_push_elem;
      col_push_elem.link.qre_prev = col_push_elem.link.qre_next;
      col_push_ps.link.qre_prev = col_push_ps.link.qre_next;
      if (col_push_ps.link.qre_next != (emitter_col_t *)0x0) {
        col_push_elem.link.qre_next = ((col_push_ps.link.qre_next)->link).qre_prev;
        ((col_push_ps.link.qre_next)->link).qre_prev = &col_push_elem;
        col_push_elem.link.qre_prev = col_push_elem.link.qre_next;
        ((((col_push_ps.link.qre_next)->link).qre_prev)->link).qre_next = col_push_ps.link.qre_next;
        ((col_push_elem.link.qre_next)->link).qre_next = &col_push_elem;
      }
      col_push_elem.justify = emitter_justify_right;
      col_push_elem.width = 0xc;
      col_push_elem.type = emitter_type_uint64;
      header_push_elem.link.qre_next = &header_push_elem;
      header_push_elem.link.qre_prev = header_push_elem.link.qre_next;
      header_push_ps.link.qre_prev = header_push_ps.link.qre_next;
      if (header_push_ps.link.qre_next != (emitter_col_t *)0x0) {
        header_push_elem.link.qre_next = ((header_push_ps.link.qre_next)->link).qre_prev;
        ((header_push_ps.link.qre_next)->link).qre_prev = &header_push_elem;
        header_push_elem.link.qre_prev = header_push_elem.link.qre_next;
        ((((header_push_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_push_ps.link.qre_next;
        ((header_push_elem.link.qre_next)->link).qre_next = &header_push_elem;
      }
      header_push_elem.justify = emitter_justify_right;
      header_push_elem.width = 0xc;
      header_push_elem.type = emitter_type_title;
      header_push_elem.field_3.str_val = "push_elem";
      local_f40.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)&col_push_elem_ps;
      col_push_elem_ps.link.qre_next = (emitter_col_t *)local_f40.cols.qlh_first;
      col_push_elem_ps.link.qre_prev = (emitter_col_t *)local_f40.cols.qlh_first;
      col_push_elem.link.qre_prev = col_push_elem.link.qre_next;
      if (col_push_elem.link.qre_next != (emitter_col_t *)0x0) {
        local_f40.cols.qlh_first =
             (anon_struct_8_1_803fbc3e_for_cols)((col_push_elem.link.qre_next)->link).qre_prev;
        col_push_elem_ps.link.qre_next = (emitter_col_t *)local_f40.cols.qlh_first;
        ((col_push_elem.link.qre_next)->link).qre_prev = &col_push_elem_ps;
        col_push_elem_ps.link.qre_prev = (emitter_col_t *)local_f40.cols.qlh_first;
        ((((col_push_elem.link.qre_next)->link).qre_prev)->link).qre_next =
             col_push_elem.link.qre_next;
        (((emitter_col_t *)local_f40.cols.qlh_first)->link).qre_next = &col_push_elem_ps;
      }
      col_push_elem_ps.justify = emitter_justify_right;
      col_push_elem_ps.width = 8;
      col_push_elem_ps.type = emitter_type_uint64;
      local_f38.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)&header_push_elem_ps;
      header_push_elem_ps.link.qre_next = (emitter_col_t *)local_f38.cols.qlh_first;
      header_push_elem_ps.link.qre_prev = (emitter_col_t *)local_f38.cols.qlh_first;
      header_push_elem.link.qre_prev = header_push_elem.link.qre_next;
      if (header_push_elem.link.qre_next != (emitter_col_t *)0x0) {
        local_f38.cols.qlh_first =
             (anon_struct_8_1_803fbc3e_for_cols)((header_push_elem.link.qre_next)->link).qre_prev;
        header_push_elem_ps.link.qre_next = (emitter_col_t *)local_f38.cols.qlh_first;
        ((header_push_elem.link.qre_next)->link).qre_prev = &header_push_elem_ps;
        header_push_elem_ps.link.qre_prev = (emitter_col_t *)local_f38.cols.qlh_first;
        ((((header_push_elem.link.qre_next)->link).qre_prev)->link).qre_next =
             header_push_elem.link.qre_next;
        (((emitter_col_t *)local_f38.cols.qlh_first)->link).qre_next = &header_push_elem_ps;
      }
      header_push_elem_ps.justify = emitter_justify_right;
      header_push_elem_ps.width = 8;
      header_push_elem_ps.type = emitter_type_title;
      header_push_elem_ps.field_3.str_val = "(#/sec)";
      header_justify_spacer.field_3.str_val = " ";
      col_justify_spacer.field_3.str_val = " ";
      header_push_elem_ps.link.qre_next = (emitter_col_t *)local_f38.cols.qlh_first;
      header_push_elem_ps.link.qre_prev = (emitter_col_t *)local_f38.cols.qlh_first;
      col_push_elem_ps.link.qre_next = (emitter_col_t *)local_f40.cols.qlh_first;
      col_push_elem_ps.link.qre_prev = (emitter_col_t *)local_f40.cols.qlh_first;
      if ((char)local_f1c == '\0') {
        iVar6 = 0xf;
      }
      else {
        mutex_stats_init_cols(&local_f40,(char *)0x0,(emitter_col_t *)0x0,col_mutex64,col_mutex32);
        mutex_stats_init_cols
                  (&local_f38,(char *)0x0,(emitter_col_t *)0x0,header_mutex64,header_mutex32);
        iVar6 = local_5b0.width + -5;
      }
      local_5b0.width = iVar6;
      emitter_table_printf(emitter,"bins:");
      eVar3.cols.qlh_first = local_f38.cols.qlh_first;
      eVar1.cols.qlh_first = local_f38.cols.qlh_first;
      if (emitter->output == emitter_output_table) {
        do {
          if (eVar1.cols.qlh_first == (emitter_col_t *)0x0) break;
          emitter_print_value(emitter,((emitter_col_t *)eVar1.cols.qlh_first)->justify,
                              ((emitter_col_t *)eVar1.cols.qlh_first)->width,
                              ((emitter_col_t *)eVar1.cols.qlh_first)->type,
                              &((emitter_col_t *)eVar1.cols.qlh_first)->field_3);
          eVar1.cols.qlh_first =
               (anon_struct_8_1_803fbc3e_for_cols)
               (((emitter_col_t *)eVar1.cols.qlh_first)->link).qre_next;
        } while (eVar1.cols.qlh_first != eVar3.cols.qlh_first);
        emitter_table_printf(emitter,anon_var_dwarf_64382b4 + 8);
      }
      emitter_json_array_kv_begin(emitter,"bins");
      arenas_bin_mib[0] = 7;
      lVar2 = *in_FS_OFFSET;
      tsd = (tsd_t *)(lVar2 + -0x2a90);
      ptVar10 = tsd;
      if (*(char *)(lVar2 + -0x2758) != '\0') {
        ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      iVar6 = duckdb_je_ctl_mibnametomib(ptVar10,stats_arenas_mib,0,"stats.arenas",arenas_bin_mib);
      if (iVar6 == 0) {
        stats_arenas_mib[2] = (size_t)i;
        arenas_bin_mib[0] = 7;
        ptVar10 = tsd;
        if (*(char *)(lVar2 + -0x2758) != '\0') {
          ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar6 = duckdb_je_ctl_mibnametomib(ptVar10,stats_arenas_mib,3,"bins",arenas_bin_mib);
        if (iVar6 == 0) {
          miblen_new_2 = 7;
          ptVar10 = tsd;
          if (*(char *)(lVar2 + -0x2758) != '\0') {
            ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
          }
          iVar6 = duckdb_je_ctl_mibnametomib(ptVar10,arenas_bin_mib,0,"arenas.bin",&miblen_new_2);
          if (iVar6 == 0) {
            if (nbins == 0) {
              uVar15 = 0;
            }
            else {
              uptime_s = uptime / 1000000000;
              uVar13 = 0;
              uVar15 = 0;
              do {
                miblen_new_2 = 7;
                sz_2 = 8;
                ptVar10 = tsd;
                stats_arenas_mib[4] = uVar13;
                arenas_bin_mib[2] = uVar13;
                if (*(char *)(lVar2 + -0x2758) != '\0') {
                  ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                pcVar11 = "nslabs";
                iVar6 = duckdb_je_ctl_bymibname
                                  (ptVar10,stats_arenas_mib,5,"nslabs",&miblen_new_2,&nslabs,&sz_2,
                                   (void *)0x0,0);
                if (iVar6 != 0) goto LAB_001fa48c;
                local_f00 = (undefined4)CONCAT71((int7)((ulong)pcVar11 >> 8),nslabs == 0);
                if ((~(byte)uVar15 & 1) == 0 && nslabs != 0) {
                  emitter_table_printf(emitter,"                     ---\n");
LAB_001f903f:
                  miblen_new_2 = 7;
                  sz_2 = 8;
                  ptVar10 = tsd;
                  if (*(char *)(lVar2 + -0x2758) != '\0') {
                    ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                  }
                  iVar6 = duckdb_je_ctl_bymibname
                                    (ptVar10,arenas_bin_mib,3,"size",&miblen_new_2,&reg_size,&sz_2,
                                     (void *)0x0,0);
                  if (iVar6 == 0) {
                    miblen_new_2 = 7;
                    sz_2 = 4;
                    ptVar10 = tsd;
                    if (*(char *)(lVar2 + -0x2758) != '\0') {
                      ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                    }
                    iVar6 = duckdb_je_ctl_bymibname
                                      (ptVar10,arenas_bin_mib,3,"nregs",&miblen_new_2,&nregs,&sz_2,
                                       (void *)0x0,0);
                    if (iVar6 == 0) {
                      miblen_new_2 = 7;
                      sz_2 = 8;
                      ptVar10 = tsd;
                      if (*(char *)(lVar2 + -0x2758) != '\0') {
                        ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                      }
                      iVar6 = duckdb_je_ctl_bymibname
                                        (ptVar10,arenas_bin_mib,3,"slab_size",&miblen_new_2,
                                         &slab_size,&sz_2,(void *)0x0,0);
                      if (iVar6 == 0) {
                        miblen_new_2 = 7;
                        sz_2 = 4;
                        ptVar10 = tsd;
                        if (*(char *)(lVar2 + -0x2758) != '\0') {
                          ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                        }
                        iVar6 = duckdb_je_ctl_bymibname
                                          (ptVar10,arenas_bin_mib,3,"nshards",&miblen_new_2,&nshards
                                           ,&sz_2,(void *)0x0,0);
                        if (iVar6 == 0) {
                          miblen_new_2 = 7;
                          sz_2 = 8;
                          ptVar10 = tsd;
                          if (*(char *)(lVar2 + -0x2758) != '\0') {
                            ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                          }
                          iVar6 = duckdb_je_ctl_bymibname
                                            (ptVar10,stats_arenas_mib,5,"nmalloc",&miblen_new_2,
                                             &nmalloc,&sz_2,(void *)0x0,0);
                          if (iVar6 == 0) {
                            miblen_new_2 = 7;
                            sz_2 = 8;
                            ptVar10 = tsd;
                            if (*(char *)(lVar2 + -0x2758) != '\0') {
                              ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                            }
                            iVar6 = duckdb_je_ctl_bymibname
                                              (ptVar10,stats_arenas_mib,5,"ndalloc",&miblen_new_2,
                                               &ndalloc,&sz_2,(void *)0x0,0);
                            if (iVar6 == 0) {
                              miblen_new_2 = 7;
                              sz_2 = 8;
                              ptVar10 = tsd;
                              if (*(char *)(lVar2 + -0x2758) != '\0') {
                                ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                              }
                              iVar6 = duckdb_je_ctl_bymibname
                                                (ptVar10,stats_arenas_mib,5,"curregs",&miblen_new_2,
                                                 &curregs,&sz_2,(void *)0x0,0);
                              if (iVar6 == 0) {
                                miblen_new_2 = 7;
                                sz_2 = 8;
                                ptVar10 = tsd;
                                if (*(char *)(lVar2 + -0x2758) != '\0') {
                                  ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                }
                                iVar6 = duckdb_je_ctl_bymibname
                                                  (ptVar10,stats_arenas_mib,5,"nrequests",
                                                   &miblen_new_2,&nrequests,&sz_2,(void *)0x0,0);
                                if (iVar6 == 0) {
                                  miblen_new_2 = 7;
                                  sz_2 = 8;
                                  ptVar10 = tsd;
                                  if (*(char *)(lVar2 + -0x2758) != '\0') {
                                    ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                  }
                                  iVar6 = duckdb_je_ctl_bymibname
                                                    (ptVar10,stats_arenas_mib,5,"nfills",
                                                     &miblen_new_2,&nfills,&sz_2,(void *)0x0,0);
                                  if (iVar6 == 0) {
                                    miblen_new_2 = 7;
                                    sz_2 = 8;
                                    ptVar10 = tsd;
                                    if (*(char *)(lVar2 + -0x2758) != '\0') {
                                      ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                    }
                                    iVar6 = duckdb_je_ctl_bymibname
                                                      (ptVar10,stats_arenas_mib,5,"nflushes",
                                                       &miblen_new_2,&nflushes,&sz_2,(void *)0x0,0);
                                    if (iVar6 == 0) {
                                      miblen_new_2 = 7;
                                      sz_2 = 8;
                                      ptVar10 = tsd;
                                      if (*(char *)(lVar2 + -0x2758) != '\0') {
                                        ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                      }
                                      iVar6 = duckdb_je_ctl_bymibname
                                                        (ptVar10,stats_arenas_mib,5,"nreslabs",
                                                         &miblen_new_2,&nreslabs,&sz_2,(void *)0x0,0
                                                        );
                                      if (iVar6 == 0) {
                                        miblen_new_2 = 7;
                                        sz_2 = 8;
                                        ptVar10 = tsd;
                                        if (*(char *)(lVar2 + -0x2758) != '\0') {
                                          ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                        }
                                        iVar6 = duckdb_je_ctl_bymibname
                                                          (ptVar10,stats_arenas_mib,5,"curslabs",
                                                           &miblen_new_2,&curslabs,&sz_2,(void *)0x0
                                                           ,0);
                                        if (iVar6 == 0) {
                                          miblen_new_2 = 7;
                                          sz_2 = 8;
                                          ptVar10 = tsd;
                                          if (*(char *)(lVar2 + -0x2758) != '\0') {
                                            ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                          }
                                          iVar6 = duckdb_je_ctl_bymibname
                                                            (ptVar10,stats_arenas_mib,5,
                                                             "nonfull_slabs",&miblen_new_2,
                                                             &nonfull_slabs,&sz_2,(void *)0x0,0);
                                          if (iVar6 == 0) {
                                            miblen_new_2 = 7;
                                            sz_2 = 8;
                                            ptVar10 = tsd;
                                            if (*(char *)(lVar2 + -0x2758) != '\0') {
                                              ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                            }
                                            iVar6 = duckdb_je_ctl_bymibname
                                                              (ptVar10,stats_arenas_mib,5,
                                                               "batch_pops",&miblen_new_2,
                                                               &batch_pops,&sz_2,(void *)0x0,0);
                                            if (iVar6 == 0) {
                                              miblen_new_2 = 7;
                                              sz_2 = 8;
                                              ptVar10 = tsd;
                                              if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                              }
                                              iVar6 = duckdb_je_ctl_bymibname
                                                                (ptVar10,stats_arenas_mib,5,
                                                                 "batch_failed_pushes",&miblen_new_2
                                                                 ,&batch_failed_pushes,&sz_2,
                                                                 (void *)0x0,0);
                                              if (iVar6 == 0) {
                                                miblen_new_2 = 7;
                                                sz_2 = 8;
                                                ptVar10 = tsd;
                                                if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                  ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                }
                                                iVar6 = duckdb_je_ctl_bymibname
                                                                  (ptVar10,stats_arenas_mib,5,
                                                                   "batch_pushes",&miblen_new_2,
                                                                   &batch_pushes,&sz_2,(void *)0x0,0
                                                                  );
                                                if (iVar6 == 0) {
                                                  miblen_new_2 = 7;
                                                  sz_2 = 8;
                                                  ptVar10 = tsd;
                                                  if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                    ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                  }
                                                  iVar6 = duckdb_je_ctl_bymibname
                                                                    (ptVar10,stats_arenas_mib,5,
                                                                     "batch_pushed_elems",
                                                                     &miblen_new_2,
                                                                     &batch_pushed_elems,&sz_2,
                                                                     (void *)0x0,0);
                                                  if (iVar6 == 0) {
                                                    if ((char)local_f1c == '\0') {
LAB_001f9a39:
                                                      eVar7 = emitter->output;
                                                      if (eVar7 < emitter_output_table) {
                                                        if (emitter->emitted_key == true) {
                                                          emitter->emitted_key = false;
                                                        }
                                                        else {
                                                          if (emitter->item_at_depth == true) {
                                                            emitter_printf(emitter,",");
                                                            eVar7 = emitter->output;
                                                          }
                                                          if (eVar7 != emitter_output_json_compact)
                                                          {
                                                            emitter_printf(emitter,
                                                  anon_var_dwarf_64382b4 + 8);
                                                  pcVar11 = anon_var_dwarf_6438689 + 7;
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar11 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar6 = emitter->nesting_depth <<
                                                            (emitter->output != emitter_output_json)
                                                    ;
                                                    if (iVar6 < 2) {
                                                      iVar6 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar11);
                                                      iVar6 = iVar6 + -1;
                                                    } while (iVar6 != 0);
                                                  }
                                                  }
                                                  }
                                                  emitter_printf(emitter,"{");
                                                  emitter->nesting_depth =
                                                       emitter->nesting_depth + 1;
                                                  emitter->item_at_depth = false;
                                                  }
                                                  emitter_json_kv(emitter,"nmalloc",
                                                                  emitter_type_uint64,&nmalloc);
                                                  emitter_json_kv(emitter,"ndalloc",
                                                                  emitter_type_uint64,&ndalloc);
                                                  emitter_json_kv(emitter,"curregs",
                                                                  emitter_type_size,&curregs);
                                                  emitter_json_kv(emitter,"nrequests",
                                                                  emitter_type_uint64,&nrequests);
                                                  emitter_json_kv(emitter,"nfills",
                                                                  emitter_type_uint64,&nfills);
                                                  emitter_json_kv(emitter,"nflushes",
                                                                  emitter_type_uint64,&nflushes);
                                                  emitter_json_kv(emitter,"nreslabs",
                                                                  emitter_type_uint64,&nreslabs);
                                                  emitter_json_kv(emitter,"curslabs",
                                                                  emitter_type_size,&curslabs);
                                                  emitter_json_kv(emitter,"nonfull_slabs",
                                                                  emitter_type_size,&nonfull_slabs);
                                                  emitter_json_kv(emitter,"batch_pops",
                                                                  emitter_type_uint64,&batch_pops);
                                                  emitter_json_kv(emitter,"batch_failed_pushes",
                                                                  emitter_type_uint64,
                                                                  &batch_failed_pushes);
                                                  emitter_json_kv(emitter,"batch_pushes",
                                                                  emitter_type_uint64,&batch_pushes)
                                                  ;
                                                  emitter_json_kv(emitter,"batch_pushed_elems",
                                                                  emitter_type_uint64,
                                                                  &batch_pushed_elems);
                                                  uVar16 = uptime_s;
                                                  if ((char)local_f1c == '\0') {
LAB_001f9d00:
                                                    uVar16 = uptime_s;
                                                    if (emitter->output < emitter_output_table) {
                                                      emitter->nesting_depth =
                                                           emitter->nesting_depth + -1;
                                                      emitter->item_at_depth = true;
                                                      if (emitter->output !=
                                                          emitter_output_json_compact) {
                                                        emitter_printf(emitter,
                                                  anon_var_dwarf_64382b4 + 8);
                                                  pcVar11 = anon_var_dwarf_6438689 + 7;
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar11 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar6 = emitter->nesting_depth <<
                                                            (emitter->output != emitter_output_json)
                                                    ;
                                                    if (iVar6 < 2) {
                                                      iVar6 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar11);
                                                      iVar6 = iVar6 + -1;
                                                    } while (iVar6 != 0);
                                                  }
                                                  }
                                                  emitter_printf(emitter,"}");
                                                  uVar16 = uptime_s;
                                                  }
                                                  }
                                                  else {
                                                    emitter_json_object_kv_begin(emitter,"mutex");
                                                    mutex_stats_emit(emitter,(emitter_row_t *)0x0,
                                                                     col_mutex64,col_mutex32);
                                                    if (emitter->output < emitter_output_table) {
                                                      emitter->nesting_depth =
                                                           emitter->nesting_depth + -1;
                                                      emitter->item_at_depth = true;
                                                      if (emitter->output !=
                                                          emitter_output_json_compact) {
                                                        emitter_printf(emitter,
                                                  anon_var_dwarf_64382b4 + 8);
                                                  pcVar11 = anon_var_dwarf_6438689 + 7;
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar11 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar6 = emitter->nesting_depth <<
                                                            (emitter->output != emitter_output_json)
                                                    ;
                                                    if (iVar6 < 2) {
                                                      iVar6 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar11);
                                                      iVar6 = iVar6 + -1;
                                                    } while (iVar6 != 0);
                                                  }
                                                  }
                                                  emitter_printf(emitter,"}");
                                                  goto LAB_001f9d00;
                                                  }
                                                  }
                                                  uVar12 = nregs * curslabs;
                                                  if (uVar12 < curregs || uVar12 == 0) {
                                                    if (uVar12 == 0) {
LAB_001f9e1b:
                                                      pcVar11 = "1";
                                                    }
                                                    else {
                                                      pcVar11 = " race";
                                                    }
                                                    duckdb_je_malloc_snprintf
                                                              ((char *)&miblen_new_2,6,pcVar11);
                                                  }
                                                  else {
                                                    auVar4._8_8_ = 0;
                                                    auVar4._0_8_ = uVar12;
                                                    auVar5._8_8_ = 0;
                                                    auVar5._0_8_ = curregs * 1000;
                                                    uVar8 = SUB164(auVar5 / auVar4,0);
                                                    if (uVar8 < 10) {
                                                      pcVar11 = "0.00%u";
                                                    }
                                                    else if (uVar8 < 100) {
                                                      pcVar11 = "0.0%u";
                                                    }
                                                    else {
                                                      if (999 < uVar8) goto LAB_001f9e1b;
                                                      pcVar11 = "0.%u";
                                                    }
                                                    duckdb_je_malloc_snprintf
                                                              ((char *)&miblen_new_2,6,pcVar11,
                                                               SUB168(auVar5 / auVar4,0) &
                                                               0xffffffff);
                                                  }
                                                  eVar1.cols.qlh_first = local_f40.cols.qlh_first;
                                                  local_350.field_3.uint64_val = curregs * reg_size;
                                                  local_300.field_3.size_val = reg_size;
                                                  local_328.field_3.int_val = (int)uVar13;
                                                  local_378.field_3.uint64_val = nmalloc;
                                                  local_3a0.field_3.uint64_val = nmalloc;
                                                  if (uptime == 0) {
                                                    local_3a0.field_3.uint64_val = 0;
                                                  }
                                                  if (nmalloc != 0 && 999999999 < uptime) {
                                                    local_3a0.field_3.uint64_val = nmalloc / uVar16;
                                                  }
                                                  local_3c8.field_3.uint64_val = ndalloc;
                                                  col_ndalloc_ps.field_3.uint64_val = ndalloc;
                                                  if (uptime == 0) {
                                                    col_ndalloc_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (ndalloc != 0 && 999999999 < uptime) {
                                                    col_ndalloc_ps.field_3.uint64_val =
                                                         ndalloc / uVar16;
                                                  }
                                                  col_nrequests.field_3.uint64_val = nrequests;
                                                  col_nrequests_ps.field_3.uint64_val = nrequests;
                                                  if (uptime == 0) {
                                                    col_nrequests_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nrequests != 0 && 999999999 < uptime) {
                                                    col_nrequests_ps.field_3.uint64_val =
                                                         nrequests / uVar16;
                                                  }
                                                  col_pgs.field_3.uint64_val = slab_size / page;
                                                  col_nshards.field_3.uint32_val = nshards;
                                                  col_curregs.field_3.size_val = curregs;
                                                  col_curslabs.field_3.size_val = curslabs;
                                                  col_nonfull_slabs.field_3.size_val = nonfull_slabs
                                                  ;
                                                  col_regs.field_3.uint32_val = nregs;
                                                  col_nfills.field_3.uint64_val = nfills;
                                                  col_nfills_ps.field_3.uint64_val = nfills;
                                                  if (uptime == 0) {
                                                    col_nfills_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nfills != 0 && 999999999 < uptime) {
                                                    col_nfills_ps.field_3.uint64_val =
                                                         nfills / uVar16;
                                                  }
                                                  col_nflushes.field_3.uint64_val = nflushes;
                                                  col_nflushes_ps.field_3.uint64_val = nflushes;
                                                  if (uptime == 0) {
                                                    col_nflushes_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nflushes != 0 && 999999999 < uptime) {
                                                    col_nflushes_ps.field_3.uint64_val =
                                                         nflushes / uVar16;
                                                  }
                                                  col_nslabs.field_3.uint64_val = nslabs;
                                                  col_nreslabs.field_3.uint64_val = nreslabs;
                                                  col_nreslabs_ps.field_3.uint64_val = nreslabs;
                                                  if (uptime == 0) {
                                                    col_nreslabs_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nreslabs != 0 && 999999999 < uptime) {
                                                    col_nreslabs_ps.field_3.uint64_val =
                                                         nreslabs / uVar16;
                                                  }
                                                  col_pops.field_3.uint64_val = batch_pops;
                                                  col_pops_ps.field_3.uint64_val = batch_pops;
                                                  if (uptime == 0) {
                                                    col_pops_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_pops != 0 && 999999999 < uptime) {
                                                    col_pops_ps.field_3.uint64_val =
                                                         batch_pops / uVar16;
                                                  }
                                                  col_failed_push.field_3.uint64_val =
                                                       batch_failed_pushes;
                                                  col_failed_push_ps.field_3.uint64_val =
                                                       batch_failed_pushes;
                                                  if (uptime == 0) {
                                                    col_failed_push_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_failed_pushes != 0 && 999999999 < uptime
                                                     ) {
                                                    col_failed_push_ps.field_3.uint64_val =
                                                         batch_failed_pushes / uVar16;
                                                  }
                                                  col_push.field_3.uint64_val = batch_pushes;
                                                  col_push_ps.field_3.uint64_val = batch_pushes;
                                                  if (uptime == 0) {
                                                    col_push_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_pushes != 0 && 999999999 < uptime) {
                                                    col_push_ps.field_3.uint64_val =
                                                         batch_pushes / uVar16;
                                                  }
                                                  col_push_elem.field_3.uint64_val =
                                                       batch_pushed_elems;
                                                  col_push_elem_ps.field_3.uint64_val =
                                                       batch_pushed_elems;
                                                  if (uptime == 0) {
                                                    col_push_elem_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_pushed_elems != 0 && 999999999 < uptime)
                                                  {
                                                    col_push_elem_ps.field_3.uint64_val =
                                                         batch_pushed_elems / uVar16;
                                                  }
                                                  col_util.field_3.str_val = (char *)&miblen_new_2;
                                                  eVar3.cols.qlh_first = local_f40.cols.qlh_first;
                                                  if (emitter->output == emitter_output_table) {
                                                    do {
                                                      if (eVar3.cols.qlh_first ==
                                                          (emitter_col_t *)0x0) break;
                                                      emitter_print_value(emitter,((emitter_col_t *)
                                                                                  eVar3.cols.
                                                                                  qlh_first)->
                                                                                  justify,
                                                                          ((emitter_col_t *)
                                                                          eVar3.cols.qlh_first)->
                                                                          width,((emitter_col_t *)
                                                                                eVar3.cols.qlh_first
                                                                                )->type,
                                                                          &((emitter_col_t *)
                                                                           eVar3.cols.qlh_first)->
                                                                           field_3);
                                                      eVar3.cols.qlh_first =
                                                           (anon_struct_8_1_803fbc3e_for_cols)
                                                           (((emitter_col_t *)eVar3.cols.qlh_first)
                                                           ->link).qre_next;
                                                    } while (eVar3.cols.qlh_first !=
                                                             eVar1.cols.qlh_first);
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_64382b4 + 8);
                                                  }
                                                  goto LAB_001fa1ba;
                                                  }
                                                  miblen_new_2 = 7;
                                                  ptVar10 = tsd;
                                                  if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                    ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                  }
                                                  iVar6 = duckdb_je_ctl_mibnametomib
                                                                    (ptVar10,stats_arenas_mib,5,
                                                                     "mutex",&miblen_new_2);
                                                  if (iVar6 != 0) goto LAB_001fa49d;
                                                  col_mutex64[0].type = emitter_type_uint64;
                                                  miblen_new_2 = 7;
                                                  sz_2 = 8;
                                                  ptVar10 = tsd;
                                                  if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                    ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                  }
                                                  iVar6 = duckdb_je_ctl_bymibname
                                                                    (ptVar10,stats_arenas_mib,6,
                                                                     "num_ops",&miblen_new_2,
                                                                     &col_mutex64[0].field_3,&sz_2,
                                                                     (void *)0x0,0);
                                                  if (iVar6 == 0) {
                                                    col_mutex64[1].type = emitter_type_uint64;
                                                    col_mutex64[1].field_3 = col_mutex64[0].field_3;
                                                    if (uptime == 0) {
                                                      col_mutex64[1].field_3.uint64_val = 0;
                                                    }
                                                    if (col_mutex64[0].field_3.uint64_val != 0 &&
                                                        999999999 < uptime) {
                                                      col_mutex64[1].field_3.uint64_val =
                                                           col_mutex64[0].field_3.uint64_val /
                                                           uptime_s;
                                                    }
                                                    col_mutex64[2].type = emitter_type_uint64;
                                                    miblen_new_2 = 7;
                                                    sz_2 = 8;
                                                    ptVar10 = tsd;
                                                    if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                      ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                    }
                                                    iVar6 = duckdb_je_ctl_bymibname
                                                                      (ptVar10,stats_arenas_mib,6,
                                                                       "num_wait",&miblen_new_2,
                                                                       &col_mutex64[2].field_3,&sz_2
                                                                       ,(void *)0x0,0);
                                                    if (iVar6 == 0) {
                                                      col_mutex64[3].type = emitter_type_uint64;
                                                      col_mutex64[3].field_3 =
                                                           col_mutex64[2].field_3;
                                                      if (uptime == 0) {
                                                        col_mutex64[3].field_3.uint64_val = 0;
                                                      }
                                                      if (col_mutex64[2].field_3.uint64_val != 0 &&
                                                          999999999 < uptime) {
                                                        col_mutex64[3].field_3.uint64_val =
                                                             col_mutex64[2].field_3.uint64_val /
                                                             uptime_s;
                                                      }
                                                      col_mutex64[4].type = emitter_type_uint64;
                                                      miblen_new_2 = 7;
                                                      sz_2 = 8;
                                                      ptVar10 = tsd;
                                                      if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                        ptVar10 = duckdb_je_tsd_fetch_slow
                                                                            (tsd,false);
                                                      }
                                                      iVar6 = duckdb_je_ctl_bymibname
                                                                        (ptVar10,stats_arenas_mib,6,
                                                                         "num_spin_acq",
                                                                         &miblen_new_2,
                                                                         &col_mutex64[4].field_3,
                                                                         &sz_2,(void *)0x0,0);
                                                      if (iVar6 == 0) {
                                                        col_mutex64[5].type = emitter_type_uint64;
                                                        col_mutex64[5].field_3 =
                                                             col_mutex64[4].field_3;
                                                        if (uptime == 0) {
                                                          col_mutex64[5].field_3.uint64_val = 0;
                                                        }
                                                        if (col_mutex64[4].field_3.uint64_val != 0
                                                            && 999999999 < uptime) {
                                                          col_mutex64[5].field_3.uint64_val =
                                                               col_mutex64[4].field_3.uint64_val /
                                                               uptime_s;
                                                        }
                                                        col_mutex64[6].type = emitter_type_uint64;
                                                        miblen_new_2 = 7;
                                                        sz_2 = 8;
                                                        ptVar10 = tsd;
                                                        if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                          ptVar10 = duckdb_je_tsd_fetch_slow
                                                                              (tsd,false);
                                                        }
                                                        iVar6 = duckdb_je_ctl_bymibname
                                                                          (ptVar10,stats_arenas_mib,
                                                                           6,"num_owner_switch",
                                                                           &miblen_new_2,
                                                                           &col_mutex64[6].field_3,
                                                                           &sz_2,(void *)0x0,0);
                                                        if (iVar6 == 0) {
                                                          col_mutex64[7].type = emitter_type_uint64;
                                                          col_mutex64[7].field_3 =
                                                               col_mutex64[6].field_3;
                                                          if (uptime == 0) {
                                                            col_mutex64[7].field_3.uint64_val = 0;
                                                          }
                                                          if (col_mutex64[6].field_3.uint64_val != 0
                                                              && 999999999 < uptime) {
                                                            col_mutex64[7].field_3.uint64_val =
                                                                 col_mutex64[6].field_3.uint64_val /
                                                                 uptime_s;
                                                          }
                                                          col_mutex64[8].type = emitter_type_uint64;
                                                          miblen_new_2 = 7;
                                                          sz_2 = 8;
                                                          ptVar10 = tsd;
                                                          if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                            ptVar10 = duckdb_je_tsd_fetch_slow
                                                                                (tsd,false);
                                                          }
                                                          iVar6 = duckdb_je_ctl_bymibname
                                                                            (ptVar10,
                                                  stats_arenas_mib,6,"total_wait_time",&miblen_new_2
                                                  ,&col_mutex64[8].field_3,&sz_2,(void *)0x0,0);
                                                  if (iVar6 == 0) {
                                                    col_mutex64[9].type = emitter_type_uint64;
                                                    col_mutex64[9].field_3 = col_mutex64[8].field_3;
                                                    if (uptime == 0) {
                                                      col_mutex64[9].field_3.uint64_val = 0;
                                                    }
                                                    if (col_mutex64[8].field_3.uint64_val != 0 &&
                                                        999999999 < uptime) {
                                                      col_mutex64[9].field_3.uint64_val =
                                                           col_mutex64[8].field_3.uint64_val /
                                                           uptime_s;
                                                    }
                                                    col_mutex64[10].type = emitter_type_uint64;
                                                    miblen_new_2 = 7;
                                                    sz_2 = 8;
                                                    ptVar10 = tsd;
                                                    if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                      ptVar10 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                    }
                                                    iVar6 = duckdb_je_ctl_bymibname
                                                                      (ptVar10,stats_arenas_mib,6,
                                                                       "max_wait_time",&miblen_new_2
                                                                       ,&col_mutex64[10].field_3,
                                                                       &sz_2,(void *)0x0,0);
                                                    if (iVar6 == 0) {
                                                      col_mutex32[0].type = emitter_type_uint32;
                                                      miblen_new_2 = 7;
                                                      sz_2 = 4;
                                                      ptVar10 = tsd;
                                                      if (*(char *)(lVar2 + -0x2758) != '\0') {
                                                        ptVar10 = duckdb_je_tsd_fetch_slow
                                                                            (tsd,false);
                                                      }
                                                      iVar6 = duckdb_je_ctl_bymibname
                                                                        (ptVar10,stats_arenas_mib,6,
                                                                         "max_num_thds",
                                                                         &miblen_new_2,
                                                                         &col_mutex32[0].field_3,
                                                                         &sz_2,(void *)0x0,0);
                                                      if (iVar6 == 0) goto LAB_001f9a39;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
LAB_001fa48c:
                  pcVar11 = "<jemalloc>: Failure in ctl_bymibname()\n";
                  goto LAB_001fa493;
                }
                if ((nslabs != 0) || (emitter->output < emitter_output_table)) goto LAB_001f903f;
LAB_001fa1ba:
                uVar13 = uVar13 + 1;
                uVar15 = local_f00;
              } while (uVar13 < nbins);
            }
            if (emitter->output < emitter_output_table) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              if (emitter->output != emitter_output_json_compact) {
                emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
                pcVar11 = anon_var_dwarf_6438689 + 7;
                if (emitter->output != emitter_output_json) {
                  pcVar11 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar9 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar6 = 1;
                  if (1 < iVar9) {
                    iVar6 = iVar9;
                  }
                  do {
                    emitter_printf(emitter,"%s",pcVar11);
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                }
              }
              emitter_printf(emitter,"]");
            }
            if ((char)uVar15 != '\0') {
              emitter_table_printf(emitter,"                     ---\n");
            }
            return;
          }
        }
      }
LAB_001fa49d:
      pcVar11 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
LAB_001fa493:
      duckdb_je_malloc_write(pcVar11);
      abort();
    }
    pcVar11 = "arenas.nbins";
  }
  else {
    pcVar11 = "arenas.page";
  }
  duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",pcVar11);
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_bins_print(emitter_t *emitter, bool mutex, unsigned i,
    uint64_t uptime) {
	size_t page;
	bool in_gap, in_gap_prev;
	unsigned nbins, j;

	CTL_GET("arenas.page", &page, size_t);

	CTL_GET("arenas.nbins", &nbins, unsigned);

	emitter_row_t header_row;
	emitter_row_init(&header_row);

	emitter_row_t row;
	emitter_row_init(&row);

	bool prof_stats_on = config_prof && opt_prof && opt_prof_stats
	    && i == MALLCTL_ARENAS_ALL;

	COL_HDR(row, size, NULL, right, 20, size)
	COL_HDR(row, ind, NULL, right, 4, unsigned)
	COL_HDR(row, allocated, NULL, right, 13, size)
	COL_HDR(row, nmalloc, NULL, right, 13, uint64)
	COL_HDR(row, nmalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, ndalloc, NULL, right, 13, uint64)
	COL_HDR(row, ndalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nrequests, NULL, right, 13, uint64)
	COL_HDR(row, nrequests_ps, "(#/sec)", right, 10, uint64)
	COL_HDR_DECLARE(prof_live_requested);
	COL_HDR_DECLARE(prof_live_count);
	COL_HDR_DECLARE(prof_accum_requested);
	COL_HDR_DECLARE(prof_accum_count);
	if (prof_stats_on) {
		COL_HDR_INIT(row, prof_live_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_live_count, NULL, right, 17, uint64)
		COL_HDR_INIT(row, prof_accum_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_accum_count, NULL, right, 17, uint64)
	}
	COL_HDR(row, nshards, NULL, right, 9, unsigned)
	COL_HDR(row, curregs, NULL, right, 13, size)
	COL_HDR(row, curslabs, NULL, right, 13, size)
	COL_HDR(row, nonfull_slabs, NULL, right, 15, size)
	COL_HDR(row, regs, NULL, right, 5, unsigned)
	COL_HDR(row, pgs, NULL, right, 4, size)
	/* To buffer a right- and left-justified column. */
	COL_HDR(row, justify_spacer, NULL, right, 1, title)
	COL_HDR(row, util, NULL, right, 6, title)
	COL_HDR(row, nfills, NULL, right, 13, uint64)
	COL_HDR(row, nfills_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nflushes, NULL, right, 13, uint64)
	COL_HDR(row, nflushes_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nslabs, NULL, right, 13, uint64)
	COL_HDR(row, nreslabs, NULL, right, 13, uint64)
	COL_HDR(row, nreslabs_ps, "(#/sec)", right, 8, uint64)

	COL_HDR(row, pops, NULL, right, 10, uint64)
	COL_HDR(row, pops_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, failed_push, NULL, right, 13, uint64)
	COL_HDR(row, failed_push_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, push, NULL, right, 7, uint64)
	COL_HDR(row, push_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, push_elem, NULL, right, 12, uint64)
	COL_HDR(row, push_elem_ps, "(#/sec)", right, 8, uint64)

	/* Don't want to actually print the name. */
	header_justify_spacer.str_val = " ";
	col_justify_spacer.str_val = " ";

	emitter_col_t col_mutex64[mutex_prof_num_uint64_t_counters];
	emitter_col_t col_mutex32[mutex_prof_num_uint32_t_counters];

	emitter_col_t header_mutex64[mutex_prof_num_uint64_t_counters];
	emitter_col_t header_mutex32[mutex_prof_num_uint32_t_counters];

	if (mutex) {
		mutex_stats_init_cols(&row, NULL, NULL, col_mutex64,
		    col_mutex32);
		mutex_stats_init_cols(&header_row, NULL, NULL, header_mutex64,
		    header_mutex32);
	}

	/*
	 * We print a "bins:" header as part of the table row; we need to adjust
	 * the header size column to compensate.
	 */
	header_size.width -=5;
	emitter_table_printf(emitter, "bins:");
	emitter_table_row(emitter, &header_row);
	emitter_json_array_kv_begin(emitter, "bins");

	size_t stats_arenas_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(stats_arenas_mib, 0, "stats.arenas");
	stats_arenas_mib[2] = i;
	CTL_LEAF_PREPARE(stats_arenas_mib, 3, "bins");

	size_t arenas_bin_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(arenas_bin_mib, 0, "arenas.bin");

	size_t prof_stats_mib[CTL_MAX_DEPTH];
	if (prof_stats_on) {
		CTL_LEAF_PREPARE(prof_stats_mib, 0, "prof.stats.bins");
	}

	for (j = 0, in_gap = false; j < nbins; j++) {
		uint64_t nslabs;
		size_t reg_size, slab_size, curregs;
		size_t curslabs;
		size_t nonfull_slabs;
		uint32_t nregs, nshards;
		uint64_t nmalloc, ndalloc, nrequests, nfills, nflushes;
		uint64_t nreslabs;
		uint64_t batch_pops, batch_failed_pushes, batch_pushes,
		    batch_pushed_elems;
		prof_stats_t prof_live;
		prof_stats_t prof_accum;

		stats_arenas_mib[4] = j;
		arenas_bin_mib[2] = j;

		CTL_LEAF(stats_arenas_mib, 5, "nslabs", &nslabs, uint64_t);

		if (prof_stats_on) {
			prof_stats_mib[3] = j;
			CTL_LEAF(prof_stats_mib, 4, "live", &prof_live,
			    prof_stats_t);
			CTL_LEAF(prof_stats_mib, 4, "accum", &prof_accum,
			    prof_stats_t);
		}

		in_gap_prev = in_gap;
		if (prof_stats_on) {
			in_gap = (nslabs == 0 && prof_accum.count == 0);
		} else {
			in_gap = (nslabs == 0);
		}

		if (in_gap_prev && !in_gap) {
			emitter_table_printf(emitter,
			    "                     ---\n");
		}

		if (in_gap && !emitter_outputs_json(emitter)) {
			continue;
		}

		CTL_LEAF(arenas_bin_mib, 3, "size", &reg_size, size_t);
		CTL_LEAF(arenas_bin_mib, 3, "nregs", &nregs, uint32_t);
		CTL_LEAF(arenas_bin_mib, 3, "slab_size", &slab_size, size_t);
		CTL_LEAF(arenas_bin_mib, 3, "nshards", &nshards, uint32_t);
		CTL_LEAF(stats_arenas_mib, 5, "nmalloc", &nmalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "ndalloc", &ndalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "curregs", &curregs, size_t);
		CTL_LEAF(stats_arenas_mib, 5, "nrequests", &nrequests,
		    uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nfills", &nfills, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nflushes", &nflushes, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nreslabs", &nreslabs, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "curslabs", &curslabs, size_t);
		CTL_LEAF(stats_arenas_mib, 5, "nonfull_slabs", &nonfull_slabs,
		    size_t);

		CTL_LEAF(stats_arenas_mib, 5, "batch_pops", &batch_pops,
		    uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "batch_failed_pushes",
		    &batch_failed_pushes, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "batch_pushes",
		    &batch_pushes, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "batch_pushed_elems",
		    &batch_pushed_elems, uint64_t);

		if (mutex) {
			mutex_stats_read_arena_bin(stats_arenas_mib, 5,
			    col_mutex64, col_mutex32, uptime);
		}

		emitter_json_object_begin(emitter);
		emitter_json_kv(emitter, "nmalloc", emitter_type_uint64,
		    &nmalloc);
		emitter_json_kv(emitter, "ndalloc", emitter_type_uint64,
		    &ndalloc);
		emitter_json_kv(emitter, "curregs", emitter_type_size,
		    &curregs);
		emitter_json_kv(emitter, "nrequests", emitter_type_uint64,
		    &nrequests);
		if (prof_stats_on) {
			emitter_json_kv(emitter, "prof_live_requested",
			    emitter_type_uint64, &prof_live.req_sum);
			emitter_json_kv(emitter, "prof_live_count",
			    emitter_type_uint64, &prof_live.count);
			emitter_json_kv(emitter, "prof_accum_requested",
			    emitter_type_uint64, &prof_accum.req_sum);
			emitter_json_kv(emitter, "prof_accum_count",
			    emitter_type_uint64, &prof_accum.count);
		}
		emitter_json_kv(emitter, "nfills", emitter_type_uint64,
		    &nfills);
		emitter_json_kv(emitter, "nflushes", emitter_type_uint64,
		    &nflushes);
		emitter_json_kv(emitter, "nreslabs", emitter_type_uint64,
		    &nreslabs);
		emitter_json_kv(emitter, "curslabs", emitter_type_size,
		    &curslabs);
		emitter_json_kv(emitter, "nonfull_slabs", emitter_type_size,
		    &nonfull_slabs);
		emitter_json_kv(emitter, "batch_pops",
		    emitter_type_uint64, &batch_pops);
		emitter_json_kv(emitter, "batch_failed_pushes",
		    emitter_type_uint64, &batch_failed_pushes);
		emitter_json_kv(emitter, "batch_pushes",
		    emitter_type_uint64, &batch_pushes);
		emitter_json_kv(emitter, "batch_pushed_elems",
		    emitter_type_uint64, &batch_pushed_elems);
		if (mutex) {
			emitter_json_object_kv_begin(emitter, "mutex");
			mutex_stats_emit(emitter, NULL, col_mutex64,
			    col_mutex32);
			emitter_json_object_end(emitter);
		}
		emitter_json_object_end(emitter);

		size_t availregs = nregs * curslabs;
		char util[6];
		if (get_rate_str((uint64_t)curregs, (uint64_t)availregs, util))
		{
			if (availregs == 0) {
				malloc_snprintf(util, sizeof(util), "1");
			} else if (curregs > availregs) {
				/*
				 * Race detected: the counters were read in
				 * separate mallctl calls and concurrent
				 * operations happened in between.  In this case
				 * no meaningful utilization can be computed.
				 */
				malloc_snprintf(util, sizeof(util), " race");
			} else {
				not_reached();
			}
		}

		col_size.size_val = reg_size;
		col_ind.unsigned_val = j;
		col_allocated.size_val = curregs * reg_size;
		col_nmalloc.uint64_val = nmalloc;
		col_nmalloc_ps.uint64_val = rate_per_second(nmalloc, uptime);
		col_ndalloc.uint64_val = ndalloc;
		col_ndalloc_ps.uint64_val = rate_per_second(ndalloc, uptime);
		col_nrequests.uint64_val = nrequests;
		col_nrequests_ps.uint64_val = rate_per_second(nrequests, uptime);
		if (prof_stats_on) {
			col_prof_live_requested.uint64_val = prof_live.req_sum;
			col_prof_live_count.uint64_val = prof_live.count;
			col_prof_accum_requested.uint64_val =
			    prof_accum.req_sum;
			col_prof_accum_count.uint64_val = prof_accum.count;
		}
		col_nshards.unsigned_val = nshards;
		col_curregs.size_val = curregs;
		col_curslabs.size_val = curslabs;
		col_nonfull_slabs.size_val = nonfull_slabs;
		col_regs.unsigned_val = nregs;
		col_pgs.size_val = slab_size / page;
		col_util.str_val = util;
		col_nfills.uint64_val = nfills;
		col_nfills_ps.uint64_val = rate_per_second(nfills, uptime);
		col_nflushes.uint64_val = nflushes;
		col_nflushes_ps.uint64_val = rate_per_second(nflushes, uptime);
		col_nslabs.uint64_val = nslabs;
		col_nreslabs.uint64_val = nreslabs;
		col_nreslabs_ps.uint64_val = rate_per_second(nreslabs, uptime);

		col_pops.uint64_val = batch_pops;
		col_pops_ps.uint64_val
		    = rate_per_second(batch_pops, uptime);

		col_failed_push.uint64_val = batch_failed_pushes;
		col_failed_push_ps.uint64_val
		    = rate_per_second(batch_failed_pushes, uptime);
		col_push.uint64_val = batch_pushes;
		col_push_ps.uint64_val
		    = rate_per_second(batch_pushes, uptime);

		col_push_elem.uint64_val = batch_pushed_elems;
		col_push_elem_ps.uint64_val
		    = rate_per_second(batch_pushed_elems, uptime);

		/*
		 * Note that mutex columns were initialized above, if mutex ==
		 * true.
		 */

		emitter_table_row(emitter, &row);
	}
	emitter_json_array_end(emitter); /* Close "bins". */

	if (in_gap) {
		emitter_table_printf(emitter, "                     ---\n");
	}
}